

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunCommands.cpp
# Opt level: O0

void __thiscall
EightBallIRCCommand::trigger
          (EightBallIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  undefined8 uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  __sv_type _Var5;
  size_t local_318;
  char *local_310;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  basic_string_view<char,_std::char_traits<char>_> local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2c8;
  basic_string_view<char,_std::char_traits<char>_> local_2b8;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  char *local_1a8;
  char *local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88 [2];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  string msg;
  IRC_Bot *source_local;
  EightBallIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_len;
  nick_local._M_str = (char *)channel._M_len;
  msg.field_2._8_8_ = source;
  this_local = (EightBallIRCCommand *)args_2;
  std::__cxx11::string::string((string *)local_58);
  iVar4 = rand();
  switch(iVar4 % 0x1f) {
  case 0:
    local_68 = sv("No.",3);
    std::__cxx11::string::operator=((string *)local_58,&local_68);
    break;
  case 1:
    local_88[0] = sv("Yes.",4);
    std::__cxx11::string::operator=((string *)local_58,local_88);
    break;
  case 2:
    local_98 = sv("Maybe.",6);
    std::__cxx11::string::operator=((string *)local_58,&local_98);
    break;
  case 3:
    local_a8 = sv("Seven.",6);
    std::__cxx11::string::operator=((string *)local_58,&local_a8);
    break;
  case 4:
    local_b8 = sv("Consider counseling.",0x14);
    std::__cxx11::string::operator=((string *)local_58,&local_b8);
    break;
  case 5:
    local_c8 = sv("Look into a realationship. A real one.",0x26);
    std::__cxx11::string::operator=((string *)local_58,&local_c8);
    break;
  case 6:
    local_d8 = sv("Quit asking me these deep questions, before I get deeply into you.",0x42);
    std::__cxx11::string::operator=((string *)local_58,&local_d8);
    break;
  case 7:
    local_e8 = sv("Fuck you.",9);
    std::__cxx11::string::operator=((string *)local_58,&local_e8);
    break;
  case 8:
    local_f8 = sv("Fuck me.",8);
    std::__cxx11::string::operator=((string *)local_58,&local_f8);
    break;
  case 9:
    local_108 = sv("Good thing I bend that way!",0x1b);
    std::__cxx11::string::operator=((string *)local_58,&local_108);
    break;
  case 10:
    local_138 = sv("Hai ",4);
    local_148 = sv("!",1);
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
              (&local_128,(jessilib *)&local_138,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_148,args_2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               &local_128);
    std::__cxx11::string::~string((string *)&local_128);
    break;
  case 0xb:
    local_178 = sv("Let\'s ban ",10);
    local_188 = sv("!",1);
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
              (&local_168,(jessilib *)&local_178,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_188,args_2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               &local_168);
    std::__cxx11::string::~string((string *)&local_168);
    break;
  case 0xc:
    local_198 = sv("Fuck your lineage.",0x12);
    std::__cxx11::string::operator=((string *)local_58,&local_198);
    break;
  case 0xd:
    local_1a8 = nick_local._M_str;
    local_1a0 = channel._M_str;
    local_1b8 = sv("#Jail",5);
    __x._M_str = local_1a0;
    __x._M_len = (size_t)local_1a8;
    bVar3 = std::operator==(__x,local_1b8);
    if (bVar3) {
      local_1c8 = sv("Ask me those kind of questions in #Politics",0x2b);
      std::__cxx11::string::operator=((string *)local_58,&local_1c8);
    }
    else {
      local_1d8 = sv("Ask me those kind of questions in #Jail",0x27);
      std::__cxx11::string::operator=((string *)local_58,&local_1d8);
    }
    break;
  case 0xe:
    local_1e8 = sv("I don\'t talk to slut-mongers.",0x1d);
    std::__cxx11::string::operator=((string *)local_58,&local_1e8);
    break;
  case 0xf:
    local_1f8 = sv("I only talk to slut-mongers.",0x1c);
    std::__cxx11::string::operator=((string *)local_58,&local_1f8);
    break;
  case 0x10:
    local_208 = sv("Nuclear launch detected.",0x18);
    std::__cxx11::string::operator=((string *)local_58,&local_208);
    break;
  case 0x11:
    local_218 = sv("404 - Not found.",0x10);
    std::__cxx11::string::operator=((string *)local_58,&local_218);
    break;
  case 0x12:
    local_228 = sv("I hurr u liek mudkipz?",0x16);
    std::__cxx11::string::operator=((string *)local_58,&local_228);
    break;
  case 0x13:
    local_238 = sv("Fortune might be in your favor.",0x1f);
    std::__cxx11::string::operator=((string *)local_58,&local_238);
    break;
  case 0x14:
    local_248 = sv("Fortune might not be in your favor.",0x23);
    std::__cxx11::string::operator=((string *)local_58,&local_248);
    break;
  case 0x15:
    local_258 = sv("Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, you\'re going to hell."
                   ,0x8e);
    std::__cxx11::string::operator=((string *)local_58,&local_258);
    break;
  case 0x16:
    local_268 = sv("Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, yes!"
                   ,0x7d);
    std::__cxx11::string::operator=((string *)local_58,&local_268);
    break;
  case 0x17:
    local_278 = sv("Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, it\'s approximately as likely as getting a \"yes\" from me."
                   ,0xb1);
    std::__cxx11::string::operator=((string *)local_58,&local_278);
    break;
  case 0x18:
    local_288 = sv("Fucking campers.",0x10);
    std::__cxx11::string::operator=((string *)local_58,&local_288);
    break;
  case 0x19:
    local_298 = sv("The 8ball seems to be stuck. Try again later. (Dang, you can\'t even get an 8ball to work for you? That\'s pretty sad yo)"
                   ,0x77);
    std::__cxx11::string::operator=((string *)local_58,&local_298);
    break;
  case 0x1a:
    local_2a8 = sv("The 8ball says... Go away? Wow, it really must not like you. Go away.",0x45);
    std::__cxx11::string::operator=((string *)local_58,&local_2a8);
    break;
  case 0x1b:
    local_2b8 = sv("Swag",4);
    std::__cxx11::string::operator=((string *)local_58,&local_2b8);
    break;
  case 0x1c:
    local_2c8 = sv("Based on the orbit and trajectory of the 33rd moon of the planet assinine 6, no."
                   ,0x50);
    std::__cxx11::string::operator=((string *)local_58,&local_2c8);
    break;
  case 0x1d:
    local_2d8 = sv("Based on the orbin and trajectory of the moon assinsix 9, yes!",0x3e);
    std::__cxx11::string::operator=((string *)local_58,&local_2d8);
    break;
  case 0x1e:
    local_2e8 = sv("Come visit me on the 5th planet away from Sol, and I\'ll give you whatever you want."
                   ,0x53);
    std::__cxx11::string::operator=((string *)local_58,&local_2e8);
    break;
  default:
    local_2f8 = sv("Nothingness. You suck. Go rot.",0x1e);
    std::__cxx11::string::operator=((string *)local_58,&local_2f8);
  }
  pcVar2 = nick_local._M_str;
  uVar1 = msg.field_2._8_8_;
  _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  local_318 = _Var5._M_len;
  local_310 = _Var5._M_str;
  Jupiter::IRC::Client::sendMessage(uVar1,pcVar2,channel._M_str,local_318,local_310);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void EightBallIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	std::string msg;
	switch (rand() % 31)
	{
	case 0:
		msg = "No."sv;
		break;
	case 1:
		msg = "Yes."sv;
		break;
	case 2:
		msg = "Maybe."sv;
		break;
	case 3:
		msg = "Seven."sv;
		break;
	case 4:
		msg = "Consider counseling."sv;
		break;
	case 5:
		msg = "Look into a realationship. A real one."sv;
		break;
	case 6:
		msg = "Quit asking me these deep questions, before I get deeply into you."sv;
		break;
	case 7:
		msg = "Fuck you."sv;
		break;
	case 8:
		msg = "Fuck me."sv;
		break;
	case 9:
		msg = "Good thing I bend that way!"sv;
		break;
	case 10:
		msg = jessilib::join<std::string>("Hai "sv, nick, "!"sv);
		break;
	case 11:
		msg = jessilib::join<std::string>("Let's ban "sv, nick, "!"sv);
		break;
	case 12:
		msg = "Fuck your lineage."sv;
		break;
	case 13:
		if (channel == "#Jail"sv) {
			msg = "Ask me those kind of questions in #Politics"sv;
		}
		else {
			msg = "Ask me those kind of questions in #Jail"sv;
		}
		break;
	case 14:
		msg = "I don't talk to slut-mongers."sv;
		break;
	case 15:
		msg = "I only talk to slut-mongers."sv;
		break;
	case 16:
		msg = "Nuclear launch detected."sv;
		break;
	case 17:
		msg = "404 - Not found."sv;
		break;
	case 18:
		msg = "I hurr u liek mudkipz?"sv;
		break;
	case 19:
		msg = "Fortune might be in your favor."sv;
		break;
	case 20:
		msg = "Fortune might not be in your favor."sv;
		break;
	case 21:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, you're going to hell."sv;
		break;
	case 22:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, yes!"sv;
		break;
	case 23:
		msg = "Based on the tragectory of James Bond (9007) in relationship to the 9th circle of hell located on the 3rd planet of Sol, it's approximately as likely as getting a \"yes\" from me."sv;
		break;
	case 24:
		msg = "Fucking campers."sv;
		break;
	case 25:
		msg = "The 8ball seems to be stuck. Try again later. (Dang, you can't even get an 8ball to work for you? That's pretty sad yo)"sv;
		break;
	case 26:
		msg = "The 8ball says... Go away? Wow, it really must not like you. Go away."sv;
		break;
	case 27:
		msg = "Swag"sv;
		break;
	case 28:
		msg = "Based on the orbit and trajectory of the 33rd moon of the planet assinine 6, no."sv;
		break;
	case 29:
		msg = "Based on the orbin and trajectory of the moon assinsix 9, yes!"sv;
		break;
	case 30:
		msg = "Come visit me on the 5th planet away from Sol, and I'll give you whatever you want."sv;
		break;
	default:
		msg = "Nothingness. You suck. Go rot."sv;
		break;
	}
	source->sendMessage(channel, msg);
}